

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds.cc
# Opt level: O3

Drds * aliyun::Drds::CreateDrdsClient(string *endpoint,string *appid,string *secret)

{
  pointer pcVar1;
  Drds *this;
  string host_name;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar1 = (endpoint->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + endpoint->_M_string_length);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Drds","");
  AliGetEndpointHost(&local_48,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48._M_string_length == 0) {
    this = (Drds *)0x0;
  }
  else {
    this = (Drds *)operator_new(0x38);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    pcVar1 = (appid->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + appid->_M_string_length);
    pcVar1 = (secret->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar1,pcVar1 + secret->_M_string_length);
    Drds(this,&local_a8,&local_c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

Drds* Drds::CreateDrdsClient(std::string endpoint, std::string appid, std::string secret) {
    std::string host_name = AliGetEndpointHost(endpoint, "Drds");
    if(host_name.empty()) {
      return NULL;
    }
    return new Drds(host_name, appid, secret);
  }